

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cc
# Opt level: O0

string * bloaty::DisassembleFunction_abi_cxx11_(DisassemblyInfo *info)

{
  char *pcVar1;
  string_view from;
  char *pcVar2;
  bool bVar3;
  cs_err cVar4;
  cs_err cVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  iterator this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string *in_RDI;
  string label_2;
  iterator iter_1;
  uint64_t target_1;
  iterator iter;
  string upper_match;
  string label_1;
  string match;
  string op_str;
  string_view mnemonic;
  string bytes;
  cs_insn *in_1;
  size_t i_1;
  pair<const_unsigned_long,_int> *pair;
  iterator __end1;
  iterator __begin1;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *__range1;
  int label;
  uint64_t target;
  cs_insn *in;
  size_t i;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  local_labels;
  size_t count;
  cs_insn *insn;
  csh handle;
  string *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff778;
  AlphaNum *in_stack_fffffffffffff780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  cs_arch in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  iterator in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  cs_opt_type in_stack_fffffffffffff7b4;
  cs_insn *in_stack_fffffffffffff7b8;
  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_fffffffffffff7c0;
  allocator<char> *paVar8;
  int __val;
  undefined4 in_stack_fffffffffffff818;
  AlphaNum *in_stack_fffffffffffff820;
  AlphaNum *in_stack_fffffffffffff828;
  AlphaNum *in_stack_fffffffffffff830;
  AlphaNum *in_stack_fffffffffffff838;
  Nonnull<std::string_*> in_stack_fffffffffffff840;
  char (*in_stack_fffffffffffff850) [2];
  undefined1 local_779 [33];
  string local_758 [80];
  string local_708 [128];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  _Self local_608;
  string local_600 [32];
  _Self local_5e0;
  ulong local_5d8;
  string local_5d0 [32];
  string local_5b0 [32];
  _Self local_590;
  _Self local_588;
  undefined1 local_579 [249];
  string local_480 [32];
  string local_460 [248];
  string local_368 [32];
  string *local_348;
  cs_insn **in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd68;
  uint64_t in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  uint8_t *in_stack_fffffffffffffd80;
  csh in_stack_fffffffffffffd88;
  undefined1 local_261 [249];
  string local_168 [32];
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [48];
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  string local_e0 [32];
  int *local_c0;
  ulong local_b8;
  reference local_b0;
  _Self local_a8;
  _Self local_a0;
  undefined1 *local_98;
  int local_8c;
  char *local_88;
  long local_80;
  ulong local_78;
  undefined1 local_70 [48];
  size_t local_40;
  long local_38;
  byte local_11;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  cVar4 = cs_open(in_stack_fffffffffffff790,(cs_mode)((ulong)in_stack_fffffffffffff788 >> 0x20),
                  (csh *)in_stack_fffffffffffff780);
  if ((cVar4 != CS_ERR_OK) ||
     (cVar5 = cs_option((csh)in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b4,
                        (size_t)in_stack_fffffffffffff7a8), cVar5 != CS_ERR_OK)) {
    Throw((char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
          (int)((ulong)in_stack_fffffffffffff788 >> 0x20));
  }
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
  if (sVar6 == 0) {
    Throw((char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
          (int)((ulong)in_stack_fffffffffffff788 >> 0x20));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::data(local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
  local_40 = cs_disasm(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78
                       ,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                       in_stack_fffffffffffffd60);
  if (local_40 != 0) {
    std::
    map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::map((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
           *)0x1c1dd1);
    for (local_78 = 0; local_78 < local_40; local_78 = local_78 + 1) {
      local_80 = local_38 + local_78 * 0xf8;
      bVar3 = TryGetJumpTarget((cs_arch)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                               (uint64_t *)
                               CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      pcVar2 = local_88;
      if (((bVar3) && (local_10[7]._M_str <= local_88)) &&
         (pcVar1 = local_10[7]._M_str,
         sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_10),
         pcVar2 < pcVar1 + sVar6)) {
        pmVar7 = std::
                 map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                 ::operator[](in_stack_fffffffffffff7c0,(key_type *)in_stack_fffffffffffff7b8);
        *pmVar7 = 0;
      }
    }
    local_8c = 0;
    local_98 = local_70;
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
         ::begin((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                  *)in_stack_fffffffffffff778);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
         ::end((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                *)in_stack_fffffffffffff778);
    while (bVar3 = std::operator!=(&local_a0,&local_a8), bVar3) {
      local_b0 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_> *)0x1c1f5f);
      local_b0->second = local_8c;
      local_8c = local_8c + 1;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_> *)
                 in_stack_fffffffffffff780);
    }
    for (local_b8 = 0; local_b8 < local_40; local_b8 = local_b8 + 1) {
      local_c0 = (int *)(local_38 + local_b8 * 0xf8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_f0,(char *)((long)local_c0 + 0x12),(ulong)*(ushort *)(local_c0 + 4));
      from._M_len._4_4_ = in_stack_fffffffffffff7b4;
      from._M_len._0_4_ = in_stack_fffffffffffff7b0;
      from._M_str = (char *)in_stack_fffffffffffff7b8;
      absl::BytesToHexString_abi_cxx11_(from);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                 (char *)in_stack_fffffffffffff788);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_c0 + 0x4a);
      paVar8 = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_fffffffffffff7b8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      std::allocator<char>::~allocator(&local_121);
      std::__cxx11::string::string(local_148);
      std::__cxx11::string::string(local_168);
      __val = (int)((ulong)paVar8 >> 0x20);
      if ((int)local_10[7]._M_len == 3) {
        if (*local_c0 == 0x142) {
          ReImpl::ReImpl((ReImpl *)in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
          in_stack_fffffffffffff7b8 = (cs_insn *)local_261;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,(char *)in_stack_fffffffffffff7b8,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
          ReImpl::GlobalReplace
                    ((string *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                     (ReImpl *)in_stack_fffffffffffff7a8,(string *)in_stack_fffffffffffff7a0._M_node
                    );
          std::__cxx11::string::~string((string *)(local_261 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_261);
          ReImpl::~ReImpl((ReImpl *)0x1c2144);
        }
        else if (*local_c0 == 0x1ee) {
          std::__cxx11::string::clear();
        }
        else {
          while( true ) {
            ReImpl::ReImpl((ReImpl *)in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
            local_348 = local_148;
            bVar3 = ReImpl::PartialMatch<std::__cxx11::string*>
                              ((string *)
                               CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                               (ReImpl *)in_stack_fffffffffffff788,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )in_stack_fffffffffffff780);
            in_stack_fffffffffffff7b4 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff7b4);
            ReImpl::~ReImpl((ReImpl *)0x1c2258);
            __val = (int)((ulong)paVar8 >> 0x20);
            if ((in_stack_fffffffffffff7b4 & 0x1000000) == CS_OPT_INVALID) break;
            std::__cxx11::string::string(local_368,local_148);
            absl::AsciiStrToUpper
                      ((Nonnull<std::string_*>)
                       CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
            std::operator+(in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0._M_node);
            ReImpl::ReImpl((ReImpl *)in_stack_fffffffffffff780,in_stack_fffffffffffff778);
            std::__cxx11::string::string(local_480,local_368);
            ReImpl::Replace((string *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                            (ReImpl *)in_stack_fffffffffffff7a8,
                            (string *)in_stack_fffffffffffff7a0._M_node);
            std::__cxx11::string::~string(local_480);
            ReImpl::~ReImpl((ReImpl *)0x1c2310);
            std::__cxx11::string::~string(local_460);
            std::__cxx11::string::~string(local_368);
          }
        }
      }
      ReImpl::ReImpl((ReImpl *)in_stack_fffffffffffff780,(char *)in_stack_fffffffffffff778);
      in_stack_fffffffffffff7a8 = (string *)local_579;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_fffffffffffff7b8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      ReImpl::GlobalReplace
                ((string *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (ReImpl *)in_stack_fffffffffffff7a8,(string *)in_stack_fffffffffffff7a0._M_node);
      std::__cxx11::string::~string((string *)(local_579 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_579);
      ReImpl::~ReImpl((ReImpl *)0x1c2473);
      in_stack_fffffffffffff7a0 =
           std::
           map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
           ::find((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                   *)in_stack_fffffffffffff778,(key_type *)0x1c248c);
      local_588._M_node = in_stack_fffffffffffff7a0._M_node;
      local_590._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
           ::end((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                  *)in_stack_fffffffffffff778);
      bVar3 = std::operator!=(&local_588,&local_590);
      if (bVar3) {
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_> *)0x1c24e0);
        std::__cxx11::to_string(__val);
        std::operator+(in_stack_fffffffffffff788,(char *)in_stack_fffffffffffff780);
        std::__cxx11::string::operator=(local_168,local_5b0);
        std::__cxx11::string::~string(local_5b0);
        std::__cxx11::string::~string(local_5d0);
      }
      bVar3 = TryGetJumpTarget((cs_arch)this,in_stack_fffffffffffff7b8,
                               (uint64_t *)
                               CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      if (bVar3) {
        this_00 = std::
                  map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                  ::find((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                          *)in_stack_fffffffffffff778,(key_type *)0x1c25fb);
        local_5e0._M_node = this_00._M_node;
        std::__cxx11::string::string(local_600);
        local_608._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::end((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
                    *)in_stack_fffffffffffff778);
        bVar3 = std::operator!=(&local_5e0,&local_608);
        if (bVar3) {
          if (*(ulong *)(local_c0 + 2) < local_5d8) {
            std::_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_> *)0x1c2676);
            std::__cxx11::to_string(__val);
            std::operator+((char *)in_stack_fffffffffffff788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff780);
            std::__cxx11::string::operator=(local_120,local_628);
            std::__cxx11::string::~string(local_628);
            std::__cxx11::string::~string(local_648);
          }
          else {
            std::_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_unsigned_long,_int>_> *)0x1c2726);
            std::__cxx11::to_string(__val);
            std::operator+((char *)in_stack_fffffffffffff788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff780);
            std::__cxx11::string::operator=(local_120,local_668);
            std::__cxx11::string::~string(local_668);
            std::__cxx11::string::~string(local_688);
          }
        }
        else {
          bVar3 = RangeMap::TryGetLabel
                            ((RangeMap *)this_00._M_node,
                             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                             in_stack_fffffffffffff788);
          in_stack_fffffffffffff794 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff794);
          if (bVar3) {
            std::__cxx11::string::operator=(local_120,local_600);
          }
        }
        std::__cxx11::string::~string(local_600);
      }
      absl::AlphaNum::AlphaNum
                (in_stack_fffffffffffff780,(Nullable<const_char_*>)in_stack_fffffffffffff778);
      anon_unknown_5::RightPad(in_stack_fffffffffffff7a8,(size_t)in_stack_fffffffffffff7a0._M_node);
      absl::AlphaNum::AlphaNum<std::allocator<char>>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      in_stack_fffffffffffff788 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_779;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (this,(basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7b8,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
      anon_unknown_5::RightPad(in_stack_fffffffffffff7a8,(size_t)in_stack_fffffffffffff7a0._M_node);
      absl::AlphaNum::AlphaNum<std::allocator<char>>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      absl::AlphaNum::AlphaNum
                (in_stack_fffffffffffff780,(Nullable<const_char_*>)in_stack_fffffffffffff778);
      absl::AlphaNum::AlphaNum<std::allocator<char>>
                (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      in_stack_fffffffffffff778 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8389aa;
      absl::StrAppend<char[2]>
                (in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                 in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                 (AlphaNum *)CONCAT44(cVar4,in_stack_fffffffffffff818),in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_758);
      std::__cxx11::string::~string((string *)(local_779 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_779);
      std::__cxx11::string::~string(local_708);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_e0);
    }
    cs_close((csh *)in_stack_fffffffffffff788);
    local_11 = 1;
    std::
    map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
    ::~map((map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
            *)0x1c2a99);
    if ((local_11 & 1) == 0) {
      std::__cxx11::string::~string((string *)in_RDI);
    }
    return in_RDI;
  }
  Throw((char *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
        (int)((ulong)in_stack_fffffffffffff788 >> 0x20));
}

Assistant:

std::string DisassembleFunction(const DisassemblyInfo& info) {
  std::string ret;

  csh handle;
  if (cs_open(info.arch, info.mode, &handle) != CS_ERR_OK ||
      cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON) != CS_ERR_OK) {
    THROW("Couldn't initialize Capstone");
  }

  if (info.text.size() == 0) {
    THROW("Tried to disassemble empty function.");
  }

  cs_insn *insn;
  size_t count =
      cs_disasm(handle, reinterpret_cast<const uint8_t *>(info.text.data()),
                info.text.size(), info.start_address, 0, &insn);

  if (count == 0) {
    THROW("Error disassembling function.");
  }

  std::map<uint64_t, int> local_labels;

  for (size_t i = 0; i < count; i++) {
    cs_insn *in = insn + i;
    uint64_t target;
    if (TryGetJumpTarget(info.arch, in, &target) &&
        target >= info.start_address &&
        target < info.start_address + info.text.size()) {
      local_labels[target] = 0;  // Fill in real value later.
    }
  }

  int label = 0;
  for (auto& pair : local_labels) {
    pair.second = label++;
  }

  for (size_t i = 0; i < count; i++) {
    cs_insn *in = insn + i;
    std::string bytes = absl::BytesToHexString(
        string_view(reinterpret_cast<const char*>(in->bytes), in->size));
    string_view mnemonic(in->mnemonic);
    std::string op_str(in->op_str);
    std::string match;
    std::string label;

    if (info.arch == CS_ARCH_X86) {
      if (in->id == X86_INS_LEA) {
        ReImpl::GlobalReplace(&op_str, "\\w?word ptr ", "");
      } else if (in->id == X86_INS_NOP) {
        op_str.clear();
      } else {
        // qword ptr => QWORD
        while (ReImpl::PartialMatch(op_str, "(\\w?word) ptr", &match)) {
          std::string upper_match = match;
          absl::AsciiStrToUpper(&upper_match);
          ReImpl::Replace(&op_str, match + " ptr", upper_match);
        }
      }
    }

    ReImpl::GlobalReplace(&op_str, " ", "");

    auto iter = local_labels.find(in->address);
    if (iter != local_labels.end()) {
      label = std::to_string(iter->second) + ":";
    }

    uint64_t target;
    if (TryGetJumpTarget(info.arch, in, &target)) {
      auto iter = local_labels.find(target);
      std::string label;
      if (iter != local_labels.end()) {
        if (target > in->address) {
          op_str = ">" + std::to_string(iter->second);
        } else {
          op_str = "<" + std::to_string(iter->second);
        }
      } else if (info.symbol_map.vm_map.TryGetLabel(target, &label)) {
        op_str = label;
      }
    }

    absl::StrAppend(&ret, " ", RightPad(label, 4),
                    RightPad(std::string(mnemonic), 8), " ", op_str, "\n");
  }

  cs_close(&handle);
  return ret;
}